

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O3

DInterpolation * __thiscall sector_t::SetInterpolation(sector_t *this,int position,bool attach)

{
  uint uVar1;
  anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1 this_00;
  
  this_00 = (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)
            this->interpolations[position].field_0.p;
  if (this_00 == (DInterpolation *)0x0) {
LAB_006b81e6:
    switch(position) {
    case 0:
      this_00.p = (DInterpolation *)
                  M_Malloc_Dbg(0x80,
                               "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                               ,0x1f7);
      DSectorPlaneInterpolation::DSectorPlaneInterpolation
                ((DSectorPlaneInterpolation *)this_00.p,this,true,attach);
      break;
    case 1:
      this_00.p = (DInterpolation *)
                  M_Malloc_Dbg(0x80,
                               "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                               ,0x1f7);
      DSectorPlaneInterpolation::DSectorPlaneInterpolation
                ((DSectorPlaneInterpolation *)this_00.p,this,false,attach);
      break;
    case 2:
      this_00.p = (DInterpolation *)
                  M_Malloc_Dbg(0x70,
                               "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                               ,0x1f7);
      DSectorScrollInterpolation::DSectorScrollInterpolation
                ((DSectorScrollInterpolation *)this_00.p,this,true);
      break;
    case 3:
      this_00.p = (DInterpolation *)
                  M_Malloc_Dbg(0x70,
                               "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                               ,0x1f7);
      DSectorScrollInterpolation::DSectorScrollInterpolation
                ((DSectorScrollInterpolation *)this_00.p,this,false);
      break;
    default:
      goto switchD_006b81ff_default;
    }
    this->interpolations[position].field_0.p = (DInterpolation *)this_00;
    if ((DSectorPlaneInterpolation *)this_00.p == (DSectorPlaneInterpolation *)0x0) {
      _DAT_00000038 = _DAT_00000038 + 1;
      return (DInterpolation *)0x0;
    }
  }
  else if (((((DInterpolation *)&(this_00.p)->super_DObject)->super_DObject).ObjectFlags & 0x20) !=
           0) {
    this->interpolations[position].field_0 =
         (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)0x0;
    goto LAB_006b81e6;
  }
  if (((((DInterpolation *)&(this_00.p)->super_DObject)->super_DObject).ObjectFlags & 0x20) == 0) {
    (this_00.p)->refcount = (this_00.p)->refcount + 1;
    uVar1 = (((DInterpolation *)&(this_00.p)->super_DObject)->super_DObject).ObjectFlags;
    if ((uVar1 & 0x20) == 0) {
      if ((GC::State == 1) && ((uVar1 & 3) != 0)) {
        GC::Barrier((DObject *)0x0,this_00.o);
        this_00 = (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)
                  this->interpolations[position].field_0.p;
        if ((DSectorPlaneInterpolation *)this_00.p == (DSectorPlaneInterpolation *)0x0) {
          return (DInterpolation *)0x0;
        }
      }
      if (((((DInterpolation *)&(this_00.p)->super_DObject)->super_DObject).ObjectFlags & 0x20) == 0
         ) {
        return this_00.p;
      }
    }
    this->interpolations[position].field_0 =
         (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)0x0;
  }
  else {
    this->interpolations[position].field_0 =
         (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)0x0;
    _DAT_00000038 = _DAT_00000038 + 1;
  }
switchD_006b81ff_default:
  return (DInterpolation *)0x0;
}

Assistant:

DInterpolation *sector_t::SetInterpolation(int position, bool attach)
{
	if (interpolations[position] == NULL)
	{
		DInterpolation *interp;
		switch (position)
		{
		case sector_t::CeilingMove:
			interp = new DSectorPlaneInterpolation(this, true, attach);
			break;

		case sector_t::FloorMove:
			interp = new DSectorPlaneInterpolation(this, false, attach);
			break;

		case sector_t::CeilingScroll:
			interp = new DSectorScrollInterpolation(this, true);
			break;

		case sector_t::FloorScroll:
			interp = new DSectorScrollInterpolation(this, false);
			break;

		default:
			return NULL;
		}
		interpolations[position] = interp;
	}
	interpolations[position]->AddRef();
	GC::WriteBarrier(interpolations[position]);
	return interpolations[position];
}